

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezone.cpp
# Opt level: O0

QList<QByteArray> * QTimeZone::availableTimeZoneIds(int offsetSeconds)

{
  long lVar1;
  QUtcTimeZonePrivate *this;
  QTimeZonePrivate *pQVar2;
  uint in_ESI;
  QList<QByteArray> *in_RDI;
  long in_FS_OFFSET;
  qint32 in_stack_0000007c;
  undefined4 in_stack_ffffffffffffff40;
  undefined1 local_b0 [32];
  QList<QByteArray> *in_stack_ffffffffffffff70;
  QList<QByteArray> *in_stack_ffffffffffffff78;
  QUtcTimeZonePrivate *in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QUtcTimeZonePrivate::QUtcTimeZonePrivate
            ((QUtcTimeZonePrivate *)CONCAT44(in_ESI,in_stack_ffffffffffffff40));
  QUtcTimeZonePrivate::availableTimeZoneIds(in_stack_ffffffffffffffb8,in_stack_0000007c);
  this = (QUtcTimeZonePrivate *)
         QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_global_tz>_>::operator->
                   ((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_global_tz>_>
                     *)0x5821e5);
  pQVar2 = QExplicitlySharedDataPointer<QTimeZonePrivate>::operator->
                     ((QExplicitlySharedDataPointer<QTimeZonePrivate> *)0x5821f6);
  (*pQVar2->_vptr_QTimeZonePrivate[0x17])(local_b0,pQVar2,(ulong)in_ESI);
  set_union(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  QList<QByteArray>::~QList((QList<QByteArray> *)0x582233);
  QList<QByteArray>::~QList((QList<QByteArray> *)0x582240);
  QUtcTimeZonePrivate::~QUtcTimeZonePrivate(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QList<QByteArray> QTimeZone::availableTimeZoneIds(int offsetSeconds)
{
    return set_union(QUtcTimeZonePrivate().availableTimeZoneIds(offsetSeconds),
                     global_tz->backend->availableTimeZoneIds(offsetSeconds));
}